

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O3

void __thiscall
QCompleterItemDelegate::paint
          (QCompleterItemDelegate *this,QPainter *p,QStyleOptionViewItem *opt,QModelIndex *idx)

{
  long in_FS_OFFSET;
  QStyleOptionViewItem optCopy;
  QModelIndex local_118;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_100,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_100,opt);
  local_100.showDecorationSelected = true;
  QAbstractItemView::currentIndex(&local_118,(QAbstractItemView *)this->view);
  if ((((local_118.r == idx->r) && (local_118.c == idx->c)) && (local_118.i == idx->i)) &&
     (local_118.m.ptr == (idx->m).ptr)) {
    local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
         local_100.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 1;
  }
  QStyledItemDelegate::paint((QStyledItemDelegate *)this,p,&local_100,idx);
  QBrush::~QBrush(&local_100.backgroundBrush);
  if (&(local_100.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_100.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_100.icon);
  QLocale::~QLocale(&local_100.locale);
  QFont::~QFont(&local_100.font);
  QStyleOption::~QStyleOption(&local_100.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paint(QPainter *p, const QStyleOptionViewItem& opt, const QModelIndex& idx) const override {
        QStyleOptionViewItem optCopy = opt;
        optCopy.showDecorationSelected = true;
        if (view->currentIndex() == idx)
            optCopy.state |= QStyle::State_HasFocus;
        QStyledItemDelegate::paint(p, optCopy, idx);
    }